

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  uint *puVar1;
  u8 uVar2;
  void *p;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  Column *data;
  ExprList_item *pEVar5;
  Expr *pEVar6;
  byte *pKey;
  HashElem *pHVar7;
  size_t sVar8;
  ulong uVar9;
  Column *pCVar10;
  byte bVar11;
  ushort uVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  u32 cnt;
  Hash ht;
  uint local_80;
  uint local_7c;
  Column *local_78;
  Column **local_70;
  i16 *local_68;
  ExprList_item *local_60;
  char *local_58;
  ulong local_50;
  Hash local_48;
  
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  if (pEList == (ExprList *)0x0) {
    *pnCol = 0;
    *paCol = (Column *)0x0;
    pCVar10 = (Column *)0x0;
    pcVar15 = (char *)((long)&(pParse->constraintName).z + 1);
    uVar14 = 0;
  }
  else {
    uVar14 = pEList->nExpr;
    data = (Column *)sqlite3DbMallocZero((sqlite3 *)pParse,(long)(int)uVar14 << 5);
    uVar3 = 0x7fff;
    if ((int)uVar14 < 0x7fff) {
      uVar3 = uVar14;
    }
    pcVar15 = (char *)((long)&(pParse->constraintName).z + 1);
    *pnCol = (i16)uVar3;
    *paCol = data;
    if ((long)(int)uVar14 < 1) {
      pCVar10 = data;
      uVar14 = 0;
    }
    else {
      local_60 = pEList->a;
      local_50 = (ulong)uVar3;
      uVar16 = 0;
      local_7c = uVar3;
      local_78 = data;
      local_70 = paCol;
      local_68 = pnCol;
      local_58 = pcVar15;
      do {
        pCVar10 = local_78;
        paCol = local_70;
        pnCol = local_68;
        pcVar15 = local_58;
        uVar14 = (uint)uVar16;
        if (*local_58 != '\0') break;
        pcVar15 = local_60[uVar16].zName;
        if (pcVar15 == (char *)0x0) {
          pEVar6 = local_60[uVar16].pExpr;
          while (pEVar6 != (Expr *)0x0) {
            if ((pEVar6->flags >> 0xc & 1) == 0) goto LAB_0015ca3f;
            if ((pEVar6->flags >> 0x12 & 1) == 0) {
              pEVar5 = (ExprList_item *)&pEVar6->pLeft;
            }
            else {
              pEVar5 = ((pEVar6->x).pList)->a;
            }
            pEVar6 = pEVar5->pExpr;
          }
          pEVar6 = (Expr *)0x0;
LAB_0015ca3f:
          for (; uVar2 = pEVar6->op, uVar2 == 0x82; pEVar6 = pEVar6->pRight) {
          }
          if (uVar2 == ';') {
            pCVar10 = (Column *)&pEVar6->u;
          }
          else if (uVar2 == 0x9e) {
            uVar12 = pEVar6->iColumn;
            if ((short)uVar12 < 0) {
              uVar12 = ((pEVar6->y).pTab)->iPKey;
              pcVar15 = "rowid";
              if ((short)uVar12 < 0) goto LAB_0015ca99;
            }
            pCVar10 = ((pEVar6->y).pTab)->aCol + uVar12;
          }
          else {
            pCVar10 = (Column *)&local_60[uVar16].zSpan;
          }
          pcVar15 = pCVar10->zName;
          if (pcVar15 != (char *)0x0) goto LAB_0015ca99;
          pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"column%d",(ulong)((uint)uVar16 + 1));
        }
        else {
LAB_0015ca99:
          pKey = (byte *)sqlite3DbStrDup((sqlite3 *)pParse,pcVar15);
        }
        local_80 = 0;
        while (pKey != (byte *)0x0) {
          pHVar7 = findElementWithHash(&local_48,(char *)pKey,(uint *)0x0);
          if (pHVar7->data == (void *)0x0) {
            data->zName = (char *)pKey;
            pCVar10 = (Column *)sqlite3HashInsert(&local_48,(char *)pKey,data);
            if (((pCVar10 == data) && (*local_58 == '\0')) &&
               (*(char *)((long)&(pParse->constraintName).z + 2) == '\0')) {
              *(undefined1 *)((long)&(pParse->constraintName).z + 1) = 1;
              if (0 < pParse->aTempReg[0]) {
                *(undefined4 *)&(pParse->sArg).z = 1;
              }
              puVar1 = &(pParse->sArg).n;
              *puVar1 = *puVar1 + 1;
            }
            goto LAB_0015cbb2;
          }
          sVar8 = strlen((char *)pKey);
          if ((sVar8 & 0x3fffffff) == 0) {
            uVar13 = 0;
          }
          else {
            uVar9 = (ulong)((uint)sVar8 & 0x3fffffff);
            do {
              if (uVar9 < 2) {
                bVar11 = *pKey;
                uVar9 = 0;
                break;
              }
              uVar9 = uVar9 - 1;
              bVar11 = pKey[uVar9 & 0xffffffff];
            } while (0xfffffffffffffff5 < (ulong)bVar11 - 0x3a);
            uVar13 = (ulong)((uint)sVar8 & 0x3fffffff);
            if (bVar11 == 0x3a) {
              uVar13 = uVar9 & 0xffffffff;
            }
          }
          local_80 = local_80 + 1;
          pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"%.*z:%u",uVar13,pKey);
          if (3 < local_80) {
            sqlite3_randomness(4,&local_80);
          }
        }
        data->zName = (char *)0x0;
LAB_0015cbb2:
        uVar16 = uVar16 + 1;
        data = data + 1;
        pCVar10 = local_78;
        paCol = local_70;
        pnCol = local_68;
        pcVar15 = local_58;
        uVar14 = local_7c;
      } while (uVar16 != local_50);
    }
  }
  sqlite3HashClear(&local_48);
  if (*pcVar15 == '\0') {
    return extraout_EAX;
  }
  if (uVar14 == 0) {
    iVar4 = extraout_EAX;
    if (pCVar10 == (Column *)0x0) goto LAB_0015cc76;
  }
  else {
    lVar17 = 0;
    do {
      p = *(void **)((long)&pCVar10->zName + lVar17);
      if (p != (void *)0x0) {
        sqlite3DbFreeNN((sqlite3 *)pParse,p);
      }
      lVar17 = lVar17 + 0x20;
    } while ((ulong)uVar14 << 5 != lVar17);
  }
  sqlite3DbFreeNN((sqlite3 *)pParse,pCVar10);
  iVar4 = extraout_EAX_00;
LAB_0015cc76:
  *paCol = (Column *)0x0;
  *pnCol = 0;
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( nCol>32767 ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      assert( pColExpr->op!=TK_AGG_COLUMN );
      if( pColExpr->op==TK_COLUMN ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        Table *pTab = pColExpr->y.pTab;
        assert( pTab!=0 );
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    if( zName ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}